

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

CBlockIndex * NextSyncBlock(CBlockIndex *pindex_prev,CChain *chain)

{
  long lVar1;
  CBlockIndex *pindex_00;
  CChain *in_RSI;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  undefined8 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  CBlockIndex *in_stack_ffffffffffffffd8;
  CChain *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0xf7140b);
  if (in_RDI == (CBlockIndex *)0x0) {
    pindex_00 = CChain::Genesis((CChain *)in_stack_ffffffffffffffd8);
  }
  else {
    pindex_00 = CChain::Next(in_RSI,in_stack_ffffffffffffffd8);
    if (pindex_00 == (CBlockIndex *)0x0) {
      CChain::FindFork(in_stack_fffffffffffffff0,in_RDI);
      pindex_00 = CChain::Next(in_RSI,pindex_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pindex_00;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(cs_main)
{
    AssertLockHeld(cs_main);

    if (!pindex_prev) {
        return chain.Genesis();
    }

    const CBlockIndex* pindex = chain.Next(pindex_prev);
    if (pindex) {
        return pindex;
    }

    return chain.Next(chain.FindFork(pindex_prev));
}